

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O3

bool DecodeBase58(char *psz,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
                 int max_ret_len)

{
  pointer *ppuVar1;
  int iVar2;
  byte bVar3;
  iterator __position;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __tmp;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uchar *puVar14;
  bool bVar15;
  uint uVar16;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b256;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (; (bVar3 = *psz, bVar3 - 9 < 5 || (bVar3 == 0x20)); psz = (char *)((byte *)psz + 1)) {
  }
  if (bVar3 == 0x31) {
    uVar5 = 0;
    iVar12 = 0;
    if (0 < max_ret_len) {
      iVar12 = max_ret_len;
    }
    do {
      if (iVar12 == (int)uVar5) {
        bVar15 = false;
        goto LAB_003e6969;
      }
      uVar13 = uVar5 + 1;
      lVar4 = uVar5 + 1;
      uVar5 = uVar13;
    } while (((byte *)psz)[lVar4] == 0x31);
    psz = (char *)((byte *)psz + uVar13);
  }
  else {
    uVar13 = 0;
  }
  sVar6 = strlen(psz);
  iVar12 = (int)((sVar6 * 0x2dd) / 1000) + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50,(long)iVar12,&local_51);
  uVar8 = 0;
  pbVar7 = (byte *)psz;
  do {
    pbVar7 = pbVar7 + 1;
    uVar5 = (ulong)(byte)*psz;
    if ((uVar5 < 0x21) && ((0x100003e01U >> (uVar5 & 0x3f) & 1) != 0)) goto LAB_003e68ca;
    iVar9 = (int)mapBase58[uVar5];
    uVar16 = 0;
    if (iVar9 == -1) goto LAB_003e694d;
    if (*psz != 0x31 || uVar8 != 0) {
      uVar16 = 0;
      puVar14 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        if (puVar14 ==
            local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          if (iVar9 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/base58.cpp"
                          ,0x45,"bool DecodeBase58(const char *, std::vector<unsigned char> &, int)"
                         );
          }
          break;
        }
        iVar10 = (uint)puVar14[-1] * 0x3a;
        iVar2 = iVar10 + iVar9;
        iVar11 = iVar10 + iVar9;
        puVar14[-1] = (uchar)iVar11;
        puVar14 = puVar14 + -1;
        iVar9 = iVar10 + iVar9 + 0xff;
        if (-1 < iVar11) {
          iVar9 = iVar11;
        }
        iVar9 = iVar9 >> 8;
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar8 || iVar2 - 0x100U < 0xfffffe01);
    }
    uVar8 = uVar16;
    psz = (char *)((byte *)psz + 1);
  } while ((int)(uVar8 + (int)uVar13) <= max_ret_len);
LAB_003e694a:
  uVar16 = 0;
LAB_003e694d:
  bVar15 = SUB41(uVar16,0);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_003e6969:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar15;
LAB_003e68ca:
  while ((iVar9 = (int)uVar5, iVar9 - 9U < 5 || (iVar9 == 0x20))) {
    bVar3 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    uVar5 = (ulong)bVar3;
  }
  if (iVar9 == 0) {
    puVar14 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + (int)(iVar12 - uVar8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (vch,(size_type)
                   (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   ((uVar13 & 0xffffffff) - (long)puVar14)));
    local_51 = (allocator_type)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
              (vch,uVar13 & 0xffffffff,(value_type_conflict *)&local_51);
    uVar16 = 1;
    for (; puVar14 !=
           local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
      __position._M_current =
           (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)vch,__position,puVar14);
      }
      else {
        *__position._M_current = *puVar14;
        ppuVar1 = &(vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    goto LAB_003e694d;
  }
  goto LAB_003e694a;
}

Assistant:

[[nodiscard]] static bool DecodeBase58(const char* psz, std::vector<unsigned char>& vch, int max_ret_len)
{
    // Skip leading spaces.
    while (*psz && IsSpace(*psz))
        psz++;
    // Skip and count leading '1's.
    int zeroes = 0;
    int length = 0;
    while (*psz == '1') {
        zeroes++;
        if (zeroes > max_ret_len) return false;
        psz++;
    }
    // Allocate enough space in big-endian base256 representation.
    int size = strlen(psz) * 733 /1000 + 1; // log(58) / log(256), rounded up.
    std::vector<unsigned char> b256(size);
    // Process the characters.
    static_assert(std::size(mapBase58) == 256, "mapBase58.size() should be 256"); // guarantee not out of range
    while (*psz && !IsSpace(*psz)) {
        // Decode base58 character
        int carry = mapBase58[(uint8_t)*psz];
        if (carry == -1)  // Invalid b58 character
            return false;
        int i = 0;
        for (std::vector<unsigned char>::reverse_iterator it = b256.rbegin(); (carry != 0 || i < length) && (it != b256.rend()); ++it, ++i) {
            carry += 58 * (*it);
            *it = carry % 256;
            carry /= 256;
        }
        assert(carry == 0);
        length = i;
        if (length + zeroes > max_ret_len) return false;
        psz++;
    }
    // Skip trailing spaces.
    while (IsSpace(*psz))
        psz++;
    if (*psz != 0)
        return false;
    // Skip leading zeroes in b256.
    std::vector<unsigned char>::iterator it = b256.begin() + (size - length);
    // Copy result into output vector.
    vch.reserve(zeroes + (b256.end() - it));
    vch.assign(zeroes, 0x00);
    while (it != b256.end())
        vch.push_back(*(it++));
    return true;
}